

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void __thiscall
sensors_analytics::utils::ObjectNode::SetString(ObjectNode *this,string *property_name,char *value)

{
  ostream *poVar1;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *value_local;
  string *property_name_local;
  ObjectNode *this_local;
  
  local_20 = value;
  value_local = (char *)property_name;
  property_name_local = (string *)this;
  if (value == (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"String property \'");
    poVar1 = std::operator<<(poVar1,(string *)value_local);
    poVar1 = std::operator<<(poVar1,"\' value is NULL");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,value,&local_41);
    SetString(this,property_name,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void ObjectNode::SetString(const string &property_name, const char *value) {
  if (value == NULL) {
    std::cerr << "String property '" << property_name
              << "' value is NULL"<< std::endl;
    return;
  }
  SetString(property_name, string(value));
}